

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O1

InlineResult
soul::Optimisations::inlineNextCall
          (Program *program,Function *parentFunction,Function *functionToInline)

{
  bool bVar1;
  FunctionCall *call;
  size_t blockIndex;
  pointer ppVar2;
  Statement *s;
  Statement *pSVar3;
  InlineResult local_4c;
  
  ppVar2 = (parentFunction->blocks).
           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((parentFunction->blocks).
      super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    blockIndex = 0;
    do {
      for (pSVar3 = ((ppVar2[blockIndex].object)->statements).firstObject;
          pSVar3 != (Statement *)0x0; pSVar3 = pSVar3->nextObject) {
        call = (FunctionCall *)
               __dynamic_cast(pSVar3,&heart::Statement::typeinfo,&heart::FunctionCall::typeinfo,0);
        bVar1 = true;
        if ((call != (FunctionCall *)0x0) && ((call->function).object == functionToInline)) {
          bVar1 = heart::Utilities::canFunctionBeInlined(program,parentFunction,call);
          if (bVar1) {
            makeFunctionCallInline(program,parentFunction,blockIndex,call);
          }
          local_4c = (InlineResult)!bVar1;
          bVar1 = false;
        }
        if (!bVar1) break;
      }
      if (pSVar3 != (Statement *)0x0) {
        return local_4c;
      }
      blockIndex = blockIndex + 1;
      ppVar2 = (parentFunction->blocks).
               super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (blockIndex <
             (ulong)((long)(parentFunction->blocks).
                           super__Vector_base<soul::pool_ref<soul::heart::Block>,_std::allocator<soul::pool_ref<soul::heart::Block>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 3));
  }
  return noneFound;
}

Assistant:

static InlineResult inlineNextCall (Program& program, heart::Function& parentFunction, heart::Function& functionToInline)
    {
        for (size_t blockIndex = 0; blockIndex < parentFunction.blocks.size(); ++blockIndex)
        {
            for (auto s : parentFunction.blocks[blockIndex]->statements)
            {
                if (auto call = cast<heart::FunctionCall> (*s))
                {
                    if (call->function == functionToInline)
                    {
                        if (! heart::Utilities::canFunctionBeInlined (program, parentFunction, *call))
                            return InlineResult::failed;

                        makeFunctionCallInline (program, parentFunction, blockIndex, *call);
                        return InlineResult::ok;
                    }
                }
            }
        }

        return InlineResult::noneFound;
    }